

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

size_t __thiscall google::protobuf::Message::ByteSizeLong(Message *this)

{
  int desired;
  size_t size_00;
  CachedSize *this_00;
  size_t size;
  Message *this_local;
  
  size_00 = internal::WireFormat::ByteSize(this);
  this_00 = protobuf::MessageLite::AccessCachedSize(&this->super_MessageLite);
  desired = internal::ToCachedSize(size_00);
  internal::CachedSize::Set(this_00,desired);
  return size_00;
}

Assistant:

size_t Message::ByteSizeLong() const {
  size_t size = WireFormat::ByteSize(*this);
  AccessCachedSize().Set(internal::ToCachedSize(size));
  return size;
}